

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

void __thiscall
pugi::impl::anon_unknown_0::xpath_ast_node::optimize(xpath_ast_node *this,xpath_allocator *alloc)

{
  char_t cVar1;
  xpath_ast_node *pxVar2;
  bool bVar3;
  int i;
  byte *pbVar4;
  long lVar5;
  xpath_variable *pxVar6;
  char_t *pcVar7;
  char_t cVar8;
  byte bVar9;
  xpath_ast_node *pxVar10;
  ulong uVar11;
  xpath_ast_node **ppxVar12;
  undefined8 local_98;
  xpath_variable *pxStack_90;
  undefined8 uStack_88;
  xpath_variable *pxStack_80;
  undefined8 uStack_78;
  xpath_variable *pxStack_70;
  undefined8 uStack_68;
  xpath_variable *pxStack_60;
  undefined8 local_58;
  xpath_variable *pxStack_50;
  undefined8 uStack_48;
  xpath_variable *pxStack_40;
  undefined8 uStack_38;
  xpath_variable *pxStack_30;
  undefined8 uStack_28;
  xpath_variable *pxStack_20;
  
  if (this->_left != (xpath_ast_node *)0x0) {
    optimize(this->_left,alloc);
  }
  if (this->_right != (xpath_ast_node *)0x0) {
    optimize(this->_right,alloc);
  }
  if (this->_next != (xpath_ast_node *)0x0) {
    optimize(this->_next,alloc);
  }
  bVar9 = this->_type;
  ppxVar12 = &this->_right;
  if ((bVar9 & 0xfe) == 0x10) {
    pxVar10 = *ppxVar12;
    if (pxVar10 == (xpath_ast_node *)0x0) {
      return;
    }
    if (((pxVar10->_type == '\x03') && (pxVar10->_left->_type == '\x16')) &&
       (pxVar2 = pxVar10->_right, pxVar2->_rettype == '\x02')) {
      *ppxVar12 = pxVar2;
      pxVar10 = pxVar2;
    }
    if (this->_test != '\0') {
      __assert_fail("_test == predicate_default",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/pugixml/src/pugixml.cpp"
                    ,0x2afa,
                    "void pugi::impl::(anonymous namespace)::xpath_ast_node::optimize_self(xpath_allocator *)"
                   );
    }
    if (((pxVar10->_type == '\x13') && ((pxVar10->_data).number == 1.0)) &&
       (!NAN((pxVar10->_data).number))) {
      this->_test = '\x03';
      return;
    }
    if (pxVar10->_rettype != '\x02') {
      bVar3 = is_posinv_expr(pxVar10);
      if (!bVar3) {
        return;
      }
      this->_test = '\x01';
      return;
    }
    if (2 < (byte)(pxVar10->_type - 0x13U)) {
      return;
    }
    this->_test = '\x02';
    return;
  }
  if (bVar9 == 0x2c) {
    pxVar10 = *ppxVar12;
    if (pxVar10 == (xpath_ast_node *)0x0) {
      return;
    }
    if (pxVar10->_type != '\x12') {
      return;
    }
    if (pxVar10->_next->_type != '\x12') {
      return;
    }
    pbVar4 = (pxVar10->_data).string;
    pcVar7 = (pxVar10->_next->_data).string;
    local_58 = 0;
    pxStack_50 = (xpath_variable *)0x0;
    uStack_48 = 0;
    pxStack_40 = (xpath_variable *)0x0;
    uStack_38 = 0;
    pxStack_30 = (xpath_variable *)0x0;
    uStack_28 = 0;
    pxStack_20 = (xpath_variable *)0x0;
    local_98 = 0;
    pxStack_90 = (xpath_variable *)0x0;
    uStack_88 = 0;
    pxStack_80 = (xpath_variable *)0x0;
    uStack_78 = 0;
    pxStack_70 = (xpath_variable *)0x0;
    uStack_68 = 0;
    pxStack_60 = (xpath_variable *)0x0;
    while( true ) {
      uVar11 = (ulong)*pbVar4;
      if (uVar11 == 0) break;
      bVar9 = 0x2c;
      if (((char)*pbVar4 < '\0') || (cVar1 = *pcVar7, (char)cVar1 < '\0')) goto LAB_00109752;
      if (*(char *)((long)&local_98 + uVar11) == '\0') {
        cVar8 = cVar1;
        if (cVar1 == '\0') {
          cVar8 = 0x80;
        }
        *(char_t *)((long)&local_98 + uVar11) = cVar8;
      }
      pbVar4 = pbVar4 + 1;
      pcVar7 = pcVar7 + (cVar1 != '\0');
    }
    for (lVar5 = 0; lVar5 != 0x80; lVar5 = lVar5 + 1) {
      if (*(char *)((long)&local_98 + lVar5) == '\0') {
        *(char *)((long)&local_98 + lVar5) = (char)lVar5;
      }
    }
    pxVar6 = (xpath_variable *)xpath_allocator::allocate(alloc,0x80);
    if (pxVar6 != (xpath_variable *)0x0) {
      *(undefined8 *)(pxVar6 + 4) = local_58;
      pxVar6[4]._next = pxStack_50;
      *(undefined8 *)(pxVar6 + 5) = uStack_48;
      pxVar6[5]._next = pxStack_40;
      *(undefined8 *)(pxVar6 + 6) = uStack_38;
      pxVar6[6]._next = pxStack_30;
      *(undefined8 *)(pxVar6 + 7) = uStack_28;
      pxVar6[7]._next = pxStack_20;
      *(undefined8 *)pxVar6 = local_98;
      pxVar6->_next = pxStack_90;
      *(undefined8 *)(pxVar6 + 1) = uStack_88;
      pxVar6[1]._next = pxStack_80;
      *(undefined8 *)(pxVar6 + 2) = uStack_78;
      pxVar6[2]._next = pxStack_70;
      *(undefined8 *)(pxVar6 + 3) = uStack_68;
      pxVar6[3]._next = pxStack_60;
      this->_type = ':';
      (this->_data).variable = pxVar6;
      return;
    }
    bVar9 = this->_type;
  }
  else if (bVar9 == 0x38) {
    bVar9 = this->_axis;
    if (0xc < bVar9) {
      return;
    }
    if ((0x1038U >> (bVar9 & 0x1f) & 1) == 0) {
      return;
    }
    pxVar10 = this->_left;
    if (pxVar10 == (xpath_ast_node *)0x0) {
      return;
    }
    if (pxVar10->_type != '8') {
      return;
    }
    if (pxVar10->_axis != '\x05') {
      return;
    }
    if (pxVar10->_test != '\x02') {
      return;
    }
    if (pxVar10->_right != (xpath_ast_node *)0x0) {
      return;
    }
    while( true ) {
      pxVar2 = *ppxVar12;
      if (pxVar2 == (xpath_ast_node *)0x0) {
        this->_axis = (byte)(bVar9 - 3) < 2 ^ 5;
        this->_left = pxVar10->_left;
        return;
      }
      if (pxVar2->_type != '\x10') break;
      ppxVar12 = &pxVar2->_next;
      if (pxVar2->_test != '\x01') {
        return;
      }
    }
    __assert_fail("n->_type == ast_predicate",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/pugixml/src/pugixml.cpp"
                  ,0x2b52,
                  "bool pugi::impl::(anonymous namespace)::xpath_ast_node::is_posinv_step() const");
  }
LAB_00109752:
  if ((((((bVar9 == 3) && (pxVar10 = this->_left, pxVar10 != (xpath_ast_node *)0x0)) &&
        (pxVar2 = *ppxVar12, pxVar2 != (xpath_ast_node *)0x0)) &&
       ((pxVar10->_type == '8' && (pxVar10->_axis == '\x02')))) &&
      ((pxVar10->_test == '\x01' &&
       ((pxVar10->_left == (xpath_ast_node *)0x0 && (pxVar10->_right == (xpath_ast_node *)0x0))))))
     && ((pxVar2->_type == '\x12' || ((pxVar2->_type == '\x14' && (pxVar2->_rettype == '\x03'))))))
  {
    this->_type = ';';
  }
  return;
}

Assistant:

void optimize(xpath_allocator* alloc)
		{
			if (_left)
				_left->optimize(alloc);

			if (_right)
				_right->optimize(alloc);

			if (_next)
				_next->optimize(alloc);

			// coverity[var_deref_model]
			optimize_self(alloc);
		}